

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform::
IfcCartesianTransformationOperator2DnonUniform(IfcCartesianTransformationOperator2DnonUniform *this)

{
  *(undefined ***)
   &(this->
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>
    ).field_0x20 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(char **)&this->field_0xa8 = "IfcCartesianTransformationOperator2DnonUniform";
  IfcCartesianTransformationOperator2D::IfcCartesianTransformationOperator2D
            ((IfcCartesianTransformationOperator2D *)this,&PTR_construction_vtable_24__00771458);
  (this->
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>).
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x771378;
  *(undefined8 *)
   &(this->
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>
    ).field_0x20 = 0x771440;
  *(undefined8 *)&this->field_0x10 = 0x7713a0;
  *(undefined8 *)&this->field_0x20 = 0x7713c8;
  *(undefined8 *)&this->field_0x68 = 0x7713f0;
  (this->
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x771418;
  (this->
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2DnonUniform,_1UL>).
  field_0x18 = 0;
  return;
}

Assistant:

IfcCartesianTransformationOperator2DnonUniform() : Object("IfcCartesianTransformationOperator2DnonUniform") {}